

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          SpacingMode spacing,Winding winding,bool usePointMode)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string *local_110;
  long local_108;
  string local_100;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_130 = &local_120;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar2[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  psVar3 = (string *)(plVar2 + 2);
  if ((string *)*plVar2 == psVar3) {
    local_100._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
    local_100._M_string_length = plVar2[3];
  }
  else {
    local_100._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
    local_110 = (string *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar2[3];
    local_100.field_2._M_allocated_capacity = (size_type)&local_e0;
  }
  else {
    local_e0 = *plVar4;
    local_100.field_2._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_100.field_2._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(local_100.field_2._M_local_buf);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((long *)local_100.field_2._M_allocated_capacity != &local_e0) {
    operator_delete((void *)local_100.field_2._M_allocated_capacity,local_e0 + 1);
  }
  psVar3 = &local_100;
  if (local_110 != psVar3) {
    operator_delete(local_110,(ulong)(local_100._M_dataplus._M_p + 1));
    psVar3 = extraout_RAX;
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
    psVar3 = extraout_RAX_00;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    psVar3 = extraout_RAX_01;
  }
  return psVar3;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, SpacingMode spacing, Winding winding, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + ", " + getSpacingModeShaderName(spacing)
								 + ", " + getWindingShaderName(winding)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}